

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_vfs * sqlite3_vfs_find(char *zVfs)

{
  bool bVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  sqlite3_vfs *psVar4;
  
  iVar2 = sqlite3_initialize();
  if (iVar2 != 0) {
    return (sqlite3_vfs *)0x0;
  }
  bVar1 = true;
  if ((sqlite3Config.bCoreMutex == 0) ||
     (psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar3 == (sqlite3_mutex *)0x0)) {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
    bVar1 = false;
  }
  psVar4 = vfsList;
  if (vfsList != (sqlite3_vfs *)0x0 && zVfs != (char *)0x0) {
    do {
      iVar2 = strcmp(zVfs,psVar4->zName);
      if (iVar2 == 0) goto LAB_00149984;
      psVar4 = psVar4->pNext;
    } while (psVar4 != (sqlite3_vfs *)0x0);
    psVar4 = (sqlite3_vfs *)0x0;
  }
LAB_00149984:
  if (!bVar1) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  return psVar4;
}

Assistant:

SQLITE_API sqlite3_vfs *sqlite3_vfs_find(const char *zVfs){
  sqlite3_vfs *pVfs = 0;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return 0;
#endif
#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
  sqlite3_mutex_enter(mutex);
  for(pVfs = vfsList; pVfs; pVfs=pVfs->pNext){
    if( zVfs==0 ) break;
    if( strcmp(zVfs, pVfs->zName)==0 ) break;
  }
  sqlite3_mutex_leave(mutex);
  return pVfs;
}